

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestCase.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::FboTestCase::checkFormatSupport(FboTestCase *this,deUint32 sizedFormat)

{
  uint uVar1;
  Context *pCVar2;
  bool bVar3;
  bool bVar4;
  ContextType CVar5;
  NotSupportedError *this_00;
  string *extension;
  pointer pbVar6;
  size_type __dnew;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  size_type local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  CVar5.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(CVar5,(ApiType)0x23);
  if (0x8813 < (int)sizedFormat) {
    if ((int)sizedFormat < 0x8d48) {
      if ((int)sizedFormat < 0x8c3a) {
        if ((sizedFormat == 0x8814) || (sizedFormat == 0x881a)) {
LAB_014faac3:
          if (!bVar3) goto LAB_014faac7;
        }
        else if (sizedFormat != 0x88f0) goto LAB_014faac7;
      }
      else if (1 < sizedFormat - 0x8cac) {
        if (sizedFormat == 0x8c3a) goto LAB_014faac3;
        if (sizedFormat != 0x8c43) goto LAB_014faac7;
      }
    }
    else if ((((0x2c < sizedFormat - 0x8d62) ||
              ((0x104104104001U >> ((ulong)(sizedFormat - 0x8d62) & 0x3f) & 1) == 0)) &&
             (sizedFormat != 0x8d48)) && (sizedFormat != 0x906f)) goto LAB_014faac7;
LAB_014faa61:
    local_38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    goto switchD_014fab20_caseD_8816;
  }
  uVar1 = sizedFormat - 0x8229;
  if (uVar1 < 0x14) {
    if ((0xfff05U >> (uVar1 & 0x1f) & 1) != 0) goto LAB_014faa61;
    if ((0xf0U >> (uVar1 & 0x1f) & 1) != 0) goto LAB_014faac3;
  }
  if (((sizedFormat - 0x8051 < 9) && ((0x1e1U >> (sizedFormat - 0x8051 & 0x1f) & 1) != 0)) ||
     (sizedFormat - 0x81a5 < 2)) goto LAB_014faa61;
LAB_014faac7:
  CVar5.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(CVar5,(ApiType)0x23);
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(sizedFormat) {
  case 0x822d:
  case 0x822f:
switchD_014fab20_caseD_881a:
    if (bVar3) goto switchD_014fab20_caseD_8816;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_40 = 0x1e;
    local_60._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_60,(ulong)&local_40);
    local_60.field_2._M_allocated_capacity = local_40;
    builtin_strncpy(local_60._M_dataplus._M_p,"GL_EXT_color_buffer_half_float",0x1e);
    local_60._M_string_length = local_40;
    local_60._M_dataplus._M_p[local_40] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
               &local_60);
    goto LAB_014faccb;
  case 0x822e:
  case 0x8230:
    goto switchD_014fab20_caseD_8814;
  }
  switch(sizedFormat) {
  case 0x8814:
    goto switchD_014fab20_caseD_8814;
  case 0x8815:
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_40 = 0x19;
    local_60._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_60,(ulong)&local_40);
    local_60.field_2._M_allocated_capacity = local_40;
    builtin_strncpy(local_60._M_dataplus._M_p,"GL_EXT_color_buffer_float",0x19);
    local_60._M_string_length = local_40;
    local_60._M_dataplus._M_p[local_40] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
               &local_60);
    break;
  case 0x8816:
  case 0x8817:
  case 0x8818:
  case 0x8819:
    goto switchD_014fab20_caseD_8816;
  case 0x881a:
    goto switchD_014fab20_caseD_881a;
  case 0x881b:
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_40 = 0x1e;
    local_60._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_60,(ulong)&local_40);
    local_60.field_2._M_allocated_capacity = local_40;
    builtin_strncpy(local_60._M_dataplus._M_p,"GL_EXT_color_buffer_half_float",0x1e);
    local_60._M_string_length = local_40;
    local_60._M_dataplus._M_p[local_40] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
               &local_60);
    break;
  default:
    if (sizedFormat != 0x8c3a) goto switchD_014fab20_caseD_8816;
switchD_014fab20_caseD_8814:
    if (bVar3) goto switchD_014fab20_caseD_8816;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_40 = 0x19;
    local_60._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_60,(ulong)&local_40);
    local_60.field_2._M_allocated_capacity = local_40;
    builtin_strncpy(local_60._M_dataplus._M_p,"GL_EXT_color_buffer_float",0x19);
    local_60._M_string_length = local_40;
    local_60._M_dataplus._M_p[local_40] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
               &local_60);
  }
LAB_014faccb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
switchD_014fab20_caseD_8816:
  if (local_38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pCVar2 = (this->super_TestCase).m_context;
    bVar3 = true;
    pbVar6 = local_38.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar4 = glu::ContextInfo::isExtensionSupported
                        (pCVar2->m_contextInfo,(pbVar6->_M_dataplus)._M_p);
      if (bVar4) break;
      pbVar6 = pbVar6 + 1;
      bVar3 = pbVar6 != local_38.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
    } while (bVar3);
    if (!bVar3) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Format not supported","")
      ;
      tcu::NotSupportedError::NotSupportedError(this_00,&local_60);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  return;
}

Assistant:

void FboTestCase::checkFormatSupport (deUint32 sizedFormat)
{
	const bool						isCoreFormat	= isRequiredFormat(sizedFormat, m_context.getRenderContext());
	const std::vector<std::string>	requiredExts	= (!isCoreFormat) ? getEnablingExtensions(sizedFormat, m_context.getRenderContext()) : std::vector<std::string>();

	// Check that we don't try to use invalid formats.
	DE_ASSERT(isCoreFormat || !requiredExts.empty());

	if (!requiredExts.empty() && !isAnyExtensionSupported(m_context, requiredExts))
		throw tcu::NotSupportedError("Format not supported");
}